

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O2

void client(int count)

{
  int iVar1;
  bool bVar2;
  Addr local_170;
  undefined8 local_88;
  code *local_80 [2];
  code *local_70;
  code *local_68;
  code *local_60 [2];
  code *local_50;
  code *local_48;
  TCPConnector *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar1 = 0;
  if (0 < count) {
    iVar1 = count;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    hwnet::Addr::MakeIP4Addr(&local_170,ip,0x22b8);
    local_88 = 0;
    hwnet::TCPConnector::New((Poller *)&local_40,(Addr *)&poller_,&local_170);
    local_80[1] = (code *)0x0;
    local_80[0] = onConnect;
    local_68 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
    local_60[1] = (code *)0x0;
    local_70 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
    local_60[0] = connectError;
    local_48 = std::
               _Function_handler<void_(int,_const_hwnet::Addr_&),_void_(*)(int,_const_hwnet::Addr_&)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<void_(int,_const_hwnet::Addr_&),_void_(*)(int,_const_hwnet::Addr_&)>
               ::_M_manager;
    bVar2 = hwnet::TCPConnector::Connect
                      (local_40,(ConnectCallback *)local_80,(ErrorCallback *)local_60);
    std::_Function_base::~_Function_base((_Function_base *)local_60);
    std::_Function_base::~_Function_base((_Function_base *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    if (!bVar2) {
      puts("connect error");
    }
  }
  return;
}

Assistant:

void client(int count) {
	for(int i = 0; i < count; ++i) {
		if(!TCPConnector::New(&poller_,Addr::MakeIP4Addr(ip,port))->Connect(onConnect,connectError)){
			printf("connect error\n");
		}
	}
}